

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv__signal_compare(uv_signal_t *w1,uv_signal_t *w2)

{
  uint uVar1;
  uint uVar2;
  int f2;
  int f1;
  uv_signal_t *w2_local;
  uv_signal_t *w1_local;
  
  if (w1->signum < w2->signum) {
    w1_local._4_4_ = -1;
  }
  else if (w2->signum < w1->signum) {
    w1_local._4_4_ = 1;
  }
  else {
    uVar1 = w1->flags & 0x2000000;
    uVar2 = w2->flags & 0x2000000;
    if (uVar1 < uVar2) {
      w1_local._4_4_ = -1;
    }
    else if (uVar2 < uVar1) {
      w1_local._4_4_ = 1;
    }
    else if (w1->loop < w2->loop) {
      w1_local._4_4_ = -1;
    }
    else if (w2->loop < w1->loop) {
      w1_local._4_4_ = 1;
    }
    else if (w1 < w2) {
      w1_local._4_4_ = -1;
    }
    else if (w2 < w1) {
      w1_local._4_4_ = 1;
    }
    else {
      w1_local._4_4_ = 0;
    }
  }
  return w1_local._4_4_;
}

Assistant:

static int uv__signal_compare(uv_signal_t* w1, uv_signal_t* w2) {
  int f1;
  int f2;
  /* Compare signums first so all watchers with the same signnum end up
   * adjacent.
   */
  if (w1->signum < w2->signum) return -1;
  if (w1->signum > w2->signum) return 1;

  /* Handlers without UV_SIGNAL_ONE_SHOT set will come first, so if the first
   * handler returned is a one-shot handler, the rest will be too.
   */
  f1 = w1->flags & UV_SIGNAL_ONE_SHOT;
  f2 = w2->flags & UV_SIGNAL_ONE_SHOT;
  if (f1 < f2) return -1;
  if (f1 > f2) return 1;

  /* Sort by loop pointer, so we can easily look up the first item after
   * { .signum = x, .loop = NULL }.
   */
  if (w1->loop < w2->loop) return -1;
  if (w1->loop > w2->loop) return 1;

  if (w1 < w2) return -1;
  if (w1 > w2) return 1;

  return 0;
}